

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dmi_info.cpp
# Opt level: O1

void __thiscall license::os::DmiInfo::DmiInfo(DmiInfo *this)

{
  string *this_00;
  string *this_01;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  char cVar3;
  pointer pcVar4;
  size_type sVar5;
  long *plVar6;
  size_t max_size;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *max_size_00;
  double __x;
  undefined1 auVar7 [12];
  string local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_78;
  string local_70;
  string local_50;
  
  this->_vptr_DmiInfo = (_func_int **)&PTR__DmiInfo_0056b878;
  this_00 = &this->m_sys_vendor;
  local_78 = &(this->m_sys_vendor).field_2;
  (this->m_sys_vendor)._M_dataplus._M_p = (pointer)local_78;
  (this->m_sys_vendor)._M_string_length = 0;
  (this->m_sys_vendor).field_2._M_local_buf[0] = '\0';
  max_size_00 = &(this->m_bios_vendor).field_2;
  (this->m_bios_vendor)._M_dataplus._M_p = (pointer)max_size_00;
  (this->m_bios_vendor)._M_string_length = 0;
  (this->m_bios_vendor).field_2._M_local_buf[0] = '\0';
  this_01 = &this->m_bios_description;
  paVar1 = &(this->m_bios_description).field_2;
  (this->m_bios_description)._M_dataplus._M_p = (pointer)paVar1;
  (this->m_bios_description)._M_string_length = 0;
  (this->m_bios_description).field_2._M_local_buf[0] = '\0';
  paVar2 = &(this->m_cpu_manufacturer).field_2;
  (this->m_cpu_manufacturer)._M_dataplus._M_p = (pointer)paVar2;
  (this->m_cpu_manufacturer)._M_string_length = 0;
  (this->m_cpu_manufacturer).field_2._M_local_buf[0] = '\0';
  this->m_cpu_cores = 0;
  local_80 = max_size_00;
  get_file_contents_abi_cxx11_
            (&local_70,(license *)"/sys/class/dmi/id/sys_vendor",(char *)0x100,(size_t)max_size_00);
  trim_copy(&local_50,&local_70);
  toupper_copy(&local_a0,&local_50);
  std::__cxx11::string::operator=((string *)&this->m_bios_vendor,(string *)&local_a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  get_file_contents_abi_cxx11_
            (&local_70,(license *)"/sys/class/dmi/id/modalias",(char *)0x100,(size_t)max_size_00);
  trim_copy(&local_50,&local_70);
  toupper_copy(&local_a0,&local_50);
  std::__cxx11::string::operator=((string *)this_01,(string *)&local_a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pcVar4 = (this->m_bios_description)._M_dataplus._M_p;
  max_size = (this->m_bios_description)._M_string_length;
  cVar3 = pcVar4[max_size - 1];
  if ((cVar3 == '\r') || (cVar3 == '\n')) {
    if (max_size == 0) goto LAB_0018d63b;
    (this->m_bios_description)._M_string_length = max_size - 1;
    pcVar4[max_size - 1] = '\0';
    std::__cxx11::string::_M_assign((string *)this_01);
  }
  while( true ) {
    get_file_contents_abi_cxx11_
              (&local_a0,(license *)"/sys/class/dmi/id/sys_vendor",(char *)0x100,max_size);
    std::__cxx11::string::operator=((string *)this_00,(string *)&local_a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p);
    }
    pcVar4 = (this->m_sys_vendor)._M_dataplus._M_p;
    sVar5 = (this->m_sys_vendor)._M_string_length;
    cVar3 = pcVar4[sVar5 - 2];
    if ((cVar3 != '\r') && (cVar3 != '\n')) {
      return;
    }
    if (sVar5 != 0) {
      (this->m_sys_vendor)._M_string_length = sVar5 - 1;
      pcVar4[sVar5 - 1] = '\0';
      std::__cxx11::string::_M_assign((string *)this_00);
      return;
    }
    std::__throw_out_of_range_fmt
              ("%s: __pos (which is %zu) > this->size() (which is %zu)","basic_string::erase");
LAB_0018d63b:
    auVar7 = std::__throw_out_of_range_fmt
                       ("%s: __pos (which is %zu) > this->size() (which is %zu)",
                        "basic_string::erase");
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    if (auVar7._8_4_ != 1) break;
    plVar6 = (long *)__cxa_begin_catch(auVar7._0_8_);
    std::__cxx11::string::operator=((string *)this_01,"");
    max_size = (**(code **)(*plVar6 + 0x10))(plVar6);
    _log(__x);
    __cxa_end_catch();
  }
  pcVar4 = (this->m_cpu_manufacturer)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 != paVar2) {
    operator_delete(pcVar4);
  }
  pcVar4 = (this_01->_M_dataplus)._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 != paVar1) {
    operator_delete(pcVar4);
  }
  pcVar4 = (this->m_bios_vendor)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 != local_80) {
    operator_delete(pcVar4);
  }
  pcVar4 = (this_00->_M_dataplus)._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 != local_78) {
    operator_delete(pcVar4);
  }
  _Unwind_Resume(auVar7._0_8_);
}

Assistant:

DmiInfo::DmiInfo() {
	try {
		m_bios_vendor = toupper_copy(trim_copy(get_file_contents("/sys/class/dmi/id/sys_vendor", 256)));
	} catch (const std::exception& e) {
		m_bios_vendor = "";
		LOG_DEBUG("Can not read sys_vendor %s", e.what());
	}
	try {
		m_bios_description = toupper_copy(trim_copy(get_file_contents("/sys/class/dmi/id/modalias", 256)));
		char last_char = m_bios_description[m_bios_description.length() - 1];
		if (last_char == '\r' || last_char == '\n') {
			m_bios_description = m_bios_description.erase(m_bios_description.length() - 1);
		}
	} catch (const std::exception& e) {
		m_bios_description = "";
		LOG_DEBUG("Can not read bios_description %s", e.what());
	}
	try {
		m_sys_vendor = get_file_contents("/sys/class/dmi/id/sys_vendor", 256);
		char last_char = m_sys_vendor[m_sys_vendor.length() - 2];
		if (last_char == '\r' || last_char == '\n') {
			m_sys_vendor = m_sys_vendor.erase(m_sys_vendor.length() - 1);
		}
	} catch (const std::exception& e) {
		m_sys_vendor = "";
		LOG_DEBUG("Can not read bios_description %s", e.what());
	}
}